

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void dw4_celia(dw_rom *rom)

{
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,3,0x30,0x19,0x11);
  vpatch(rom,0x12300,0x80,0,3,4,0x10,0x1a,0xf,7,7,7,0xc,0xb,0xf,5,0x12,0x3a,0x38,0,0xc0,0x20,8,0x58,
         0xf0,0xe0,0xe0,0xe0,0x30,0xd0,0xf0,0xa0,0x48,0x5c,0x1c,0x1f,0x3f,0x7f,0x66,0xf,0x1f,0x1f,
         0x3f,0x2e,0xf,0xf,1,0xf,0x1f,0x1f,0x30,0xfc,0xfc,0xf8,0x60,0xf0,0xf8,0xf8,0xfc,0x70,0xf0,
         0xf0,0x80,0xf0,0xf8,0xf8,0xfc,0);
  vpatch(rom,0x12400,0x180,0,6,1,0,2,7,0xf,7,3,1,0xe,0xf,0xd,2,2,0,0,0,0,0x40,0xc0,0x80,0,0x80,0xe0,
         0xf0,0xf8,0xb8,0x38,0x78,0xf8,0x7c,3,7,7,3,7,0xf,0xf,0x1f,0,6,7,4,7,0xf,0xf,0x1f,0xe0,0xf0,
         0xf0,0xf0,0xf0,0xf8,0xf8,0xfc,0x7e,0x3e,0x3c,0,0xf0,0xf8,0xf8,0xc,0);
  return;
}

Assistant:

static void dw4_celia(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    3,  0x30,  0x19,  0x11);
    vpatch(rom, 0x12300,  128,  0x00,  0x03,  0x04,  0x10,  0x1a,  0x0f,  0x07,  0x07,  0x07,  0x0c,  0x0b,  0x0f,  0x05,  0x12,  0x3a,  0x38,  0x00,  0xc0,  0x20,  0x08,  0x58,  0xf0,  0xe0,  0xe0,  0xe0,  0x30,  0xd0,  0xf0,  0xa0,  0x48,  0x5c,  0x1c,  0x1f,  0x3f,  0x7f,  0x66,  0x0f,  0x1f,  0x1f,  0x3f,  0x2e,  0x0f,  0x0f,  0x01,  0x0f,  0x1f,  0x1f,  0x30,  0xfc,  0xfc,  0xf8,  0x60,  0xf0,  0xf8,  0xf8,  0xfc,  0x70,  0xf0,  0xf0,  0x80,  0xf0,  0xf8,  0xf8,  0xfc,  0x00,  0x03,  0x04,  0x10,  0x1a,  0x0f,  0x07,  0x07,  0x07,  0x0c,  0x0b,  0x0f,  0x05,  0x12,  0x3a,  0x38,  0x00,  0xc0,  0x20,  0x08,  0x58,  0xf0,  0xe0,  0xe0,  0xe0,  0x30,  0xd0,  0xf0,  0xa0,  0x48,  0x5c,  0x1c,  0x3f,  0x3f,  0x1f,  0x06,  0x0f,  0x1f,  0x1f,  0x3f,  0x0e,  0x0f,  0x0f,  0x01,  0x0f,  0x1f,  0x1f,  0x3f,  0xf8,  0xfc,  0xfe,  0x66,  0xf0,  0xf8,  0xf8,  0xfc,  0x74,  0xf0,  0xf0,  0x80,  0xf0,  0xf8,  0xf8,  0x0c);
    vpatch(rom, 0x12400,  384,  0x00,  0x06,  0x01,  0x00,  0x02,  0x07,  0x0f,  0x07,  0x03,  0x01,  0x0e,  0x0f,  0x0d,  0x02,  0x02,  0x00,  0x00,  0x00,  0x00,  0x40,  0xc0,  0x80,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xb8,  0x38,  0x78,  0xf8,  0x7c,  0x03,  0x07,  0x07,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x00,  0x06,  0x07,  0x04,  0x07,  0x0f,  0x0f,  0x1f,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfc,  0x7e,  0x3e,  0x3c,  0x00,  0xf0,  0xf8,  0xf8,  0x0c,  0x00,  0x06,  0x01,  0x00,  0x02,  0x07,  0x0f,  0x07,  0x03,  0x01,  0x0e,  0x0f,  0x0d,  0x02,  0x02,  0x00,  0x00,  0x00,  0x00,  0x40,  0xc0,  0x80,  0x00,  0x80,  0xe0,  0xf0,  0xf8,  0xb8,  0x38,  0x78,  0xf8,  0x7c,  0x0f,  0x0f,  0x07,  0x03,  0x07,  0x0f,  0x0f,  0x1f,  0x01,  0x07,  0x07,  0x04,  0x07,  0x0f,  0x0f,  0x10,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfe,  0x9e,  0x9c,  0x00,  0x30,  0xf8,  0xf8,  0xfc,  0x00,  0x00,  0x00,  0x02,  0x03,  0x01,  0x00,  0x01,  0x07,  0x0f,  0x1f,  0x1d,  0x1c,  0x1e,  0x1f,  0x3e,  0x00,  0x60,  0x80,  0x00,  0x40,  0xe0,  0xf0,  0xe0,  0xc0,  0x80,  0x70,  0xf0,  0xb0,  0x40,  0x40,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7e,  0x7c,  0x3c,  0x00,  0x0f,  0x1f,  0x1f,  0x30,  0xc0,  0xe0,  0xe0,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0x00,  0x60,  0xe0,  0x20,  0xe0,  0xf0,  0xf0,  0xf8,  0x00,  0x00,  0x00,  0x02,  0x03,  0x01,  0x00,  0x01,  0x07,  0x0f,  0x1f,  0x1d,  0x1c,  0x1e,  0x1f,  0x3e,  0x00,  0x60,  0x80,  0x00,  0x40,  0xe0,  0xf0,  0xe0,  0xc0,  0x80,  0x70,  0xf0,  0xb0,  0x40,  0x40,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x1f,  0x3f,  0x7f,  0x79,  0x39,  0x00,  0x0c,  0x1f,  0x1f,  0x3f,  0xf0,  0xf0,  0xe0,  0xc0,  0xe0,  0xf0,  0xf0,  0xf8,  0x80,  0xe0,  0xe0,  0x20,  0xe0,  0xf0,  0xf0,  0x08,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x3f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xfc,  0xfc,  0x00,  0x00,  0x30,  0x37,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0x00,  0x0f,  0x1f,  0x1f,  0x3f,  0x00,  0x04,  0x08,  0xe0,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0xf8,  0xf0,  0x00,  0xf0,  0xf8,  0xf8,  0x0c,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x1f,  0x3f,  0x3f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xfc,  0xfc,  0x00,  0x20,  0x10,  0x07,  0x0f,  0x1f,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0x00,  0x0f,  0x1f,  0x1f,  0x30,  0x00,  0x00,  0x0c,  0xec,  0xf0,  0xf8,  0xf8,  0xfc,  0xfc,  0xf8,  0xf0,  0x00,  0xf0,  0xf8,  0xf8,  0xfc);
}